

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

void Js::CompoundString::AppendGeneric<8u,Js::CompoundString>
               (char16 (*s) [8],bool isCppLiteral,CompoundString *toString,bool appendChars)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString *s_00;
  char16_t *pcVar4;
  
  if ((*s)[7] != L'\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x476,"(s[AppendCharLengthPlusOne - 1] == u\'\\0\')",
                                "s[AppendCharLengthPlusOne - 1] == _u(\'\\0\')");
    if (!bVar2) goto LAB_0098fc89;
    *puVar3 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x477,"(toString)","toString");
    if (!bVar2) goto LAB_0098fc89;
    *puVar3 = 0;
  }
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)toString);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x478,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_0098fc89;
    *puVar3 = 0;
  }
  bVar2 = OwnsLastBlock(toString);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x479,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_0098fc89;
    *puVar3 = 0;
  }
  if (appendChars) {
    bVar2 = HasOnlyDirectChars(toString);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                  ,0x47a,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                  "!(appendChars && !toString->HasOnlyDirectChars())");
      if (!bVar2) {
LAB_0098fc89:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  if (!isCppLiteral) {
    AppendGeneric<Js::CompoundString>(*s,7,toString,appendChars);
    return;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
  if (bVar2) {
    pcVar4 = L"false";
    if (appendChars) {
      pcVar4 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(C++ literal \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"
                  ,s,L"",7,pcVar4);
    Output::Flush();
  }
  if (appendChars) {
    bVar2 = TryAppendGeneric<Js::CompoundString>(*s,7,toString);
LAB_0098fbc5:
    if (bVar2 == false) {
      AppendSlow(toString,*s,7);
      return;
    }
  }
  else {
    bVar2 = HasOnlyDirectChars(toString);
    if (bVar2) {
      bVar2 = Block::ShouldAppendChars(7,0x20);
      if (bVar2) {
        bVar2 = TryAppendFewCharsGeneric<Js::CompoundString>(*s,7,toString);
        goto LAB_0098fbc5;
      }
      SwitchToPointerMode(toString);
    }
    s_00 = JavascriptLibrary::CreateStringFromCppLiteral<8ul>
                     ((((toString->super_LiteralString).super_JavascriptString.
                        super_RecyclableObject.type.ptr)->javascriptLibrary).ptr,s);
    bVar2 = TryAppendGeneric<Js::CompoundString>(s_00,7,toString);
    if (!bVar2) {
      AppendSlow(toString,s_00);
      return;
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        const char16 (&s)[AppendCharLengthPlusOne],
        const bool isCppLiteral,
        String *const toString,
        const bool appendChars)
    {
        CompileAssert(AppendCharLengthPlusOne != 0);
        Assert(s);
        Assert(s[AppendCharLengthPlusOne - 1] == _u('\0'));
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        if(AppendCharLengthPlusOne == 1)
            return;
        if(AppendCharLengthPlusOne == 2)
        {
            AppendGeneric(s[0], toString, appendChars);
            return;
        }

        const CharCount appendCharLength = AppendCharLengthPlusOne - 1;
        if(!isCppLiteral)
        {
            AppendGeneric(s, appendCharLength, toString, appendChars);
            return;
        }

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(C++ literal \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"),
                s,
                appendCharLength > 8 ? _u("...") : _u(""),
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendChars || Block::ShouldAppendChars(appendCharLength, sizeof(LiteralString)))
            {
                if(appendChars
                        ? TryAppendGeneric(s, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(s, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(s, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        JavascriptString *const js = toString->GetLibrary()->CreateStringFromCppLiteral(s);
        if(TryAppendGeneric(js, appendCharLength, toString))
            return;
        toString->AppendSlow(js);
    }